

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddEnum
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          EnumValueDescriptor *value)

{
  RepeatedField<int> *this_00;
  int iVar1;
  int iVar2;
  LogMessage *other;
  long lVar3;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddEnum","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddEnum",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 8) {
    anon_unknown_0::ReportReflectionUsageTypeError(this->descriptor_,field,"AddEnum",CPPTYPE_ENUM);
  }
  if (*(long *)(value + 0x18) != *(long *)(field + 0x50)) {
    anon_unknown_0::ReportReflectionUsageEnumTypeError(this->descriptor_,field,"AddEnum",value);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    if (this->extensions_offset_ == -1) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      other = LogMessage::operator<<(&local_68,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_69,other);
      LogMessage::~LogMessage(&local_68);
    }
    ExtensionSet::AddEnum
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite +
               (long)this->extensions_offset_),*(int *)(field + 0x28),(FieldType)field[0x2c],
               *(bool *)(*(long *)(field + 0x60) + 0x44),*(int *)(value + 0x10),field);
  }
  else {
    iVar1 = *(int *)(value + 0x10);
    lVar3 = (long)this->offsets_
                  [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
                   -0x11111111];
    this_00 = (RepeatedField<int> *)((long)&(message->super_MessageLite)._vptr_MessageLite + lVar3);
    iVar2 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar3 + 4);
    if (*(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar3) == iVar2) {
      RepeatedField<int>::Reserve(this_00,iVar2 + 1);
    }
    iVar2 = this_00->current_size_;
    this_00->current_size_ = iVar2 + 1;
    this_00->elements_[iVar2] = iVar1;
  }
  return;
}

Assistant:

void GeneratedMessageReflection::AddEnum(
    Message* message, const FieldDescriptor* field,
    const EnumValueDescriptor* value) const {
  USAGE_CHECK_ALL(AddEnum, REPEATED, ENUM);
  USAGE_CHECK_ENUM_VALUE(AddEnum);

  if (field->is_extension()) {
    MutableExtensionSet(message)->AddEnum(field->number(), field->type(),
                                          field->options().packed(),
                                          value->number(), field);
  } else {
    AddField<int>(message, field, value->number());
  }
}